

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

void udata_setAppData_63(char *path,void *data,UErrorCode *err)

{
  UBool UVar1;
  undefined1 local_58 [8];
  UDataMemory udm;
  UErrorCode *err_local;
  void *data_local;
  char *path_local;
  
  if ((err != (UErrorCode *)0x0) && (udm._48_8_ = err, UVar1 = U_FAILURE(*err), UVar1 == '\0')) {
    if (data == (void *)0x0) {
      *(undefined4 *)udm._48_8_ = 1;
    }
    else {
      UDataMemory_init_63((UDataMemory *)local_58);
      UDataMemory_setData_63((UDataMemory *)local_58,data);
      udata_checkCommonData_63((UDataMemory *)local_58,(UErrorCode *)udm._48_8_);
      udata_cacheDataItem(path,(UDataMemory *)local_58,(UErrorCode *)udm._48_8_);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_setAppData(const char *path, const void *data, UErrorCode *err)
{
    UDataMemory     udm;

    if(err==NULL || U_FAILURE(*err)) {
        return;
    }
    if(data==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    UDataMemory_init(&udm);
    UDataMemory_setData(&udm, data);
    udata_checkCommonData(&udm, err);
    udata_cacheDataItem(path, &udm, err);
}